

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::Logging::formatLine
                (StringBuilder *sb,uint8_t *binData,size_t binLen,size_t dispLen,size_t imLen,
                char *comment)

{
  byte bVar1;
  Error EVar2;
  uint uVar3;
  CodeEmitter *emitter;
  char *str;
  size_t i;
  size_t len;
  long lVar4;
  size_t sVar5;
  char c;
  ulong uVar6;
  bool bVar7;
  size_t begin;
  size_t local_50;
  
  len = 0;
  if (comment != (char *)0x0) {
    do {
      if (comment[len] == '\0') goto LAB_00115e01;
      len = len + 1;
    } while (len != 0x200);
    len = 0x200;
  }
LAB_00115e01:
  if (dispLen <= binLen) {
    if (binLen - 1 < 0xfffffffffffffffe || len != 0) {
      sVar5 = sb->_length;
      bVar7 = binLen != 0xffffffffffffffff;
      c = ';';
      uVar6 = 0x28;
      local_50 = sVar5;
      while( true ) {
        if ((((sVar5 < uVar6) &&
             (EVar2 = StringBuilder::_opChars(sb,1,' ',uVar6 - sVar5), EVar2 != 0)) ||
            (EVar2 = StringBuilder::_opChar(sb,1,c), EVar2 != 0)) ||
           (EVar2 = StringBuilder::_opChar(sb,1,' '), EVar2 != 0)) {
          return EVar2;
        }
        if (!bVar7) break;
        EVar2 = StringBuilder::_opHex(sb,1,binData,binLen - (imLen + dispLen));
        if (EVar2 != 0) {
          return EVar2;
        }
        EVar2 = StringBuilder::_opChars(sb,1,'.',dispLen * 2);
        if (EVar2 != 0) {
          return EVar2;
        }
        EVar2 = StringBuilder::_opHex(sb,1,binData + (binLen - imLen),imLen);
        if (EVar2 != 0) {
          return EVar2;
        }
        if (len == 0) goto LAB_00115f71;
        lVar4 = sVar5 - local_50;
        local_50 = sb->_length;
        sVar5 = lVar4 + local_50;
        uVar6 = uVar6 + 0x1a;
        c = '|';
        bVar7 = false;
      }
      EVar2 = StringBuilder::_opString(sb,1,comment,len);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
LAB_00115f71:
    EVar2 = StringBuilder::_opChar(sb,1,'\n');
    return EVar2;
  }
  formatLine();
  uVar3 = (uint)dispLen;
  uVar6 = dispLen & 0xffffffff;
  if (uVar3 < 0x1000000) {
    str = "void";
  }
  else if ((int)(uVar6 >> 0x18) - 0x20U < 0x45) {
    bVar1 = TypeId::_info[(uVar6 >> 0x18) + 0x80];
    if ((byte)(bVar1 - 0x20) < 0x13) {
      str = &DAT_00132204 + *(int *)(&DAT_00132204 + (ulong)(byte)(bVar1 - 0x20) * 4);
    }
    else {
      if ((char)bVar1 < '\0') {
        formatFuncDetailValue();
        if (_ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0 != 0) {
          return (Error)_ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0;
        }
        EVar2 = getpagesize();
        _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0 = (ulong)(int)EVar2;
        _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_1 = 0x10000;
        if (0x10000 < _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0) {
          _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_1 = _ZZN6asmjitL19OSUtils_GetVMemInfoEvE3vmi_0;
        }
        return EVar2;
      }
      str = "unknown";
    }
    if ((byte)TypeId::_info[bVar1] < (byte)TypeId::_info[uVar6 >> 0x18]) {
      EVar2 = StringBuilder::appendFormat
                        (sb,"%sx%u",str,
                         (ulong)((byte)TypeId::_info[uVar6 >> 0x18] / (byte)TypeId::_info[bVar1]));
      goto LAB_00116042;
    }
  }
  else {
    str = "unknown";
  }
  EVar2 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
LAB_00116042:
  if (((EVar2 == 0) &&
      (((uVar3 >> 0x10 & 1) == 0 ||
       ((EVar2 = StringBuilder::_opChar(sb,1,':'), EVar2 == 0 &&
        (EVar2 = X86Logging::formatRegister
                           (sb,(uint32_t)binData,emitter,
                            (uint)(emitter->_codeInfo)._archInfo.field_0.field_0._type,
                            (uint)(uVar6 >> 8) & 0xff,uVar3 & 0xff), EVar2 == 0)))))) &&
     (((uVar3 >> 0x11 & 1) == 0 ||
      (EVar2 = StringBuilder::appendFormat(sb,":[%d]",dispLen & 0xffff), EVar2 == 0)))) {
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

Error Logging::formatLine(StringBuilder& sb, const uint8_t* binData, size_t binLen, size_t dispLen, size_t imLen, const char* comment) noexcept {
  size_t currentLen = sb.getLength();
  size_t commentLen = comment ? Utils::strLen(comment, kMaxCommentLength) : 0;

  ASMJIT_ASSERT(binLen >= dispLen);

  if ((binLen != 0 && binLen != Globals::kInvalidIndex) || commentLen) {
    size_t align = kMaxInstLength;
    char sep = ';';

    for (size_t i = (binLen == Globals::kInvalidIndex); i < 2; i++) {
      size_t begin = sb.getLength();

      // Append align.
      if (currentLen < align)
        ASMJIT_PROPAGATE(sb.appendChars(' ', align - currentLen));

      // Append separator.
      if (sep) {
        ASMJIT_PROPAGATE(sb.appendChar(sep));
        ASMJIT_PROPAGATE(sb.appendChar(' '));
      }

      // Append binary data or comment.
      if (i == 0) {
        ASMJIT_PROPAGATE(sb.appendHex(binData, binLen - dispLen - imLen));
        ASMJIT_PROPAGATE(sb.appendChars('.', dispLen * 2));
        ASMJIT_PROPAGATE(sb.appendHex(binData + binLen - imLen, imLen));
        if (commentLen == 0) break;
      }
      else {
        ASMJIT_PROPAGATE(sb.appendString(comment, commentLen));
      }

      currentLen += sb.getLength() - begin;
      align += kMaxBinaryLength;
      sep = '|';
    }
  }

  return sb.appendChar('\n');
}